

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageContrast(gdImagePtr src,double contrast)

{
  uint uVar1;
  uint uVar2;
  int color;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int y;
  int g;
  int b;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (src == (gdImagePtr)0x0) {
    return 0;
  }
  if (src->trueColor == 0) {
    pcVar3 = gdImageGetPixel;
  }
  else {
    pcVar3 = gdImageGetTrueColorPixel;
  }
  iVar7 = src->sy;
  if (0 < iVar7) {
    dVar10 = (100.0 - contrast) / 100.0;
    dVar10 = dVar10 * dVar10;
    iVar6 = src->sx;
    y = 0;
    do {
      if (0 < iVar6) {
        iVar7 = 0;
        do {
          uVar1 = (*pcVar3)(src,iVar7,y);
          if (src->trueColor == 0) {
            uVar5 = src->red[(int)uVar1];
            uVar4 = src->green[(int)uVar1];
            uVar2 = src->blue[(int)uVar1];
            uVar1 = src->alpha[(int)uVar1];
          }
          else {
            uVar5 = uVar1 >> 0x10 & 0xff;
            uVar4 = uVar1 >> 8 & 0xff;
            uVar2 = uVar1 & 0xff;
            uVar1 = uVar1 >> 0x18 & 0x7f;
          }
          dVar8 = (((double)(int)uVar5 / 255.0 + -0.5) * dVar10 + 0.5) * 255.0;
          g = 0xff;
          iVar6 = 0xff;
          if (dVar8 <= 255.0) {
            dVar9 = 0.0;
            if (0.0 <= dVar8) {
              dVar9 = dVar8;
            }
            iVar6 = (int)dVar9;
          }
          dVar8 = (((double)(int)uVar4 / 255.0 + -0.5) * dVar10 + 0.5) * 255.0;
          if (dVar8 <= 255.0) {
            dVar9 = 0.0;
            if (0.0 <= dVar8) {
              dVar9 = dVar8;
            }
            g = (int)dVar9;
          }
          dVar8 = (((double)(int)uVar2 / 255.0 + -0.5) * dVar10 + 0.5) * 255.0;
          b = 0xff;
          if (dVar8 <= 255.0) {
            dVar9 = 0.0;
            if (0.0 <= dVar8) {
              dVar9 = dVar8;
            }
            b = (int)dVar9;
          }
          color = gdImageColorAllocateAlpha(src,iVar6,g,b,uVar1);
          if (color == -1) {
            color = gdImageColorClosestAlpha(src,iVar6,g,b,uVar1);
          }
          gdImageSetPixel(src,iVar7,y,color);
          iVar7 = iVar7 + 1;
          iVar6 = src->sx;
        } while (iVar7 < iVar6);
        iVar7 = src->sy;
      }
      y = y + 1;
    } while (y < iVar7);
  }
  return 1;
}

Assistant:

BGD_DECLARE(int) gdImageContrast(gdImagePtr src, double contrast)
{
	int x, y;
	int r,g,b,a;
	double rf,gf,bf;
	int new_pxl, pxl;

	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	contrast = (double)(100.0-contrast)/100.0;
	contrast = contrast*contrast;

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f(src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			rf = (double)r/255.0;
			rf = rf-0.5;
			rf = rf*contrast;
			rf = rf+0.5;
			rf = rf*255.0;

			bf = (double)b/255.0;
			bf = bf-0.5;
			bf = bf*contrast;
			bf = bf+0.5;
			bf = bf*255.0;

			gf = (double)g/255.0;
			gf = gf-0.5;
			gf = gf*contrast;
			gf = gf+0.5;
			gf = gf*255.0;

			rf = (rf > 255.0)? 255.0 : ((rf < 0.0)? 0.0:rf);
			gf = (gf > 255.0)? 255.0 : ((gf < 0.0)? 0.0:gf);
			bf = (bf > 255.0)? 255.0 : ((bf < 0.0)? 0.0:bf);

			new_pxl = gdImageColorAllocateAlpha(src, (int)rf, (int)gf, (int)bf, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)rf, (int)gf, (int)bf, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}